

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::enqueueObjectsPCLm(QPDFWriter *this)

{
  string *psVar1;
  bool bVar2;
  element_type *peVar3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  allocator<char> local_1c9;
  string local_1c8 [32];
  QPDFObjectHandle local_1a8;
  undefined1 local_198 [8];
  QPDFObjectHandle trailer;
  QPDFObjectHandle local_178;
  reference local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *image;
  iterator __end2;
  iterator __begin2;
  Dictionary *__range2;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  undefined1 local_e8 [24];
  QPDFObjectHandle strips;
  string local_c0 [32];
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  string *local_80;
  QPDFObjectHandle *page;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> all;
  allocator<char> local_31;
  string local_30 [8];
  string image_transform_content;
  QPDFWriter *this_local;
  
  image_transform_content.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"q /image Do Q\n",&local_31);
  std::allocator<char>::~allocator(&local_31);
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __x = QPDF::getAllPages(peVar3->pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range1,__x);
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range1);
  page = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                   ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&page);
    if (!bVar2) break;
    local_80 = (string *)
               __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&__end1);
    QPDFObjectHandle::QPDFObjectHandle(&local_90,(QPDFObjectHandle *)local_80);
    enqueueObject(this,&local_90);
    QPDFObjectHandle::~QPDFObjectHandle(&local_90);
    psVar1 = local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,"/Contents",
               (allocator<char> *)
               ((long)&strips.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey(&local_a0,psVar1);
    enqueueObject(this,&local_a0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&strips.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    psVar1 = local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_108,"/Resources",&local_109);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_e8,psVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_130,"/XObject",(allocator<char> *)((long)&__range2 + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_e8 + 0x10),(string *)local_e8);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin2,(char)local_e8 + 0x10);
    __end2 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin2);
    image = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
             *)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin2);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&image);
      if (!bVar2) break;
      local_168 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                  ::operator*(&__end2);
      bVar2 = ::qpdf::BaseHandle::null(&(local_168->second).super_BaseHandle);
      if (!bVar2) {
        QPDFObjectHandle::QPDFObjectHandle(&local_178,&local_168->second);
        enqueueObject(this,&local_178);
        QPDFObjectHandle::~QPDFObjectHandle(&local_178);
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        QPDFObjectHandle::newStream
                  ((QPDF *)&trailer.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (string *)peVar3->pdf);
        enqueueObject(this,(QPDFObjectHandle *)
                           &trailer.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &trailer.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin2);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_e8 + 0x10));
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  getTrimmedTrailer((QPDFWriter *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"/Root",&local_1c9);
  QPDFObjectHandle::getKey(&local_1a8,(string *)local_198);
  enqueueObject(this,&local_1a8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_198);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range1);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
QPDFWriter::enqueueObjectsPCLm()
{
    // Image transform stream content for page strip images. Each of this new stream has to come
    // after every page image strip written in the pclm file.
    std::string image_transform_content = "q /image Do Q\n";

    // enqueue all pages first
    std::vector<QPDFObjectHandle> all = m->pdf.getAllPages();
    for (auto& page: all) {
        // enqueue page
        enqueueObject(page);

        // enqueue page contents stream
        enqueueObject(page.getKey("/Contents"));

        // enqueue all the strips for each page
        QPDFObjectHandle strips = page.getKey("/Resources").getKey("/XObject");
        for (auto& image: strips.as_dictionary()) {
            if (!image.second.null()) {
                enqueueObject(image.second);
                enqueueObject(QPDFObjectHandle::newStream(&m->pdf, image_transform_content));
            }
        }
    }

    // Put root in queue.
    QPDFObjectHandle trailer = getTrimmedTrailer();
    enqueueObject(trailer.getKey("/Root"));
}